

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O2

int __thiscall anon_unknown.dwarf_265da4::SndioCapture::recordProc(SndioCapture *this)

{
  uint uVar1;
  ALuint AVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ll_ringbuffer_data_pair data;
  undefined8 local_58;
  ulong uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  ulong uStack_40;
  
  SetRTPriority();
  althrd_setname("alsoft-record");
  AVar2 = ALCdevice::frameSizeFromFmt((this->super_BackendBase).mDevice);
  uVar7 = (ulong)AVar2;
  do {
    while( true ) {
      if ((((this->mKillNow)._M_base._M_i & 1U) != 0) ||
         (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0)) {
        return 0;
      }
      RingBuffer::getWriteVector
                ((this->mRing)._M_t.
                 super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
                 super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
                 super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl);
      uVar3 = uStack_40 + uStack_50;
      if (uVar3 != 0) break;
      uVar1 = ((this->super_BackendBase).mDevice)->UpdateSize;
      uVar3 = (ulong)uVar1;
      if ((uint)(0x1000 / uVar7) < uVar1) {
        uVar3 = 0x1000 / uVar7;
      }
      sio_read(this->mSndHandle,recordProc::junk,uVar3 * uVar7);
    }
    uStack_50 = uStack_50 * uVar7;
    uStack_40 = uStack_40 * uVar7;
    uVar8 = (ulong)((this->super_BackendBase).mDevice)->UpdateSize;
    if (uVar3 < uVar8) {
      uVar8 = uVar3;
    }
    for (uVar3 = 0; uVar4 = uVar8 * uVar7 - uVar3, uVar3 <= uVar8 * uVar7 && uVar4 != 0;
        uVar3 = uVar3 + lVar5) {
      if (uStack_50 == 0) {
        local_58 = CONCAT44(uStack_44,local_48);
        uStack_50 = uStack_40;
      }
      uVar6 = uStack_50;
      if (uVar4 < uStack_50) {
        uVar6 = uVar4;
      }
      lVar5 = sio_read(this->mSndHandle,local_58,uVar6);
      if (lVar5 == 0) {
        ALCdevice::handleDisconnect
                  ((this->super_BackendBase).mDevice,"Failed to read capture samples");
        break;
      }
      local_58 = local_58 + lVar5;
      uStack_50 = uStack_50 - lVar5;
    }
    RingBuffer::writeAdvance
              ((this->mRing)._M_t.
               super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
               super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
               super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl,uVar3 / uVar7);
  } while( true );
}

Assistant:

int SndioCapture::recordProc()
{
    SetRTPriority();
    althrd_setname(RECORD_THREAD_NAME);

    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto data = mRing->getWriteVector();
        size_t todo{data.first.len + data.second.len};
        if(todo == 0)
        {
            static char junk[4096];
            sio_read(mSndHandle, junk,
                minz(sizeof(junk)/frameSize, mDevice->UpdateSize)*frameSize);
            continue;
        }

        size_t total{0u};
        data.first.len  *= frameSize;
        data.second.len *= frameSize;
        todo = minz(todo, mDevice->UpdateSize) * frameSize;
        while(total < todo)
        {
            if(!data.first.len)
                data.first = data.second;

            size_t got{sio_read(mSndHandle, data.first.buf, minz(todo-total, data.first.len))};
            if(!got)
            {
                mDevice->handleDisconnect("Failed to read capture samples");
                break;
            }

            data.first.buf += got;
            data.first.len -= got;
            total += got;
        }
        mRing->writeAdvance(total / frameSize);
    }

    return 0;
}